

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O1

void __thiscall bdNodeManager::addFindNode(bdNodeManager *this,bdNodeId *id,uint32_t qflags)

{
  undefined8 uVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  long lVar4;
  bdId *pbVar5;
  byte bVar6;
  bdQueryPeer peer;
  bdId bStack_68;
  undefined4 local_44;
  uint32_t local_40;
  undefined2 local_3a;
  undefined4 local_38;
  undefined8 local_28;
  
  bVar6 = 0;
  iVar2 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdQueryPeer>,_std::_Select1st<std::pair<const_bdNodeId,_bdQueryPeer>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
          ::find(&(this->mActivePeers)._M_t,id);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mActivePeers)._M_t._M_impl.super__Rb_tree_header)
  {
    bdId::bdId(&bStack_68);
    bStack_68.id.data._16_4_ = *(undefined4 *)(id->data + 0x10);
    bStack_68.id.data._0_8_ = *(undefined8 *)id->data;
    bStack_68.id.data._8_8_ = *(undefined8 *)(id->data + 8);
    local_44 = 1;
    local_38 = 0;
    local_3a = 0;
    local_28 = 0;
    local_40 = qflags;
    pmVar3 = std::
             map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
             ::operator[](&this->mActivePeers,id);
    pbVar5 = &bStack_68;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined8 *)pbVar5;
      (pmVar3->mId).addr.sin_family = (short)uVar1;
      (pmVar3->mId).addr.sin_port = (short)((ulong)uVar1 >> 0x10);
      (pmVar3->mId).addr.sin_addr = (in_addr)(int)((ulong)uVar1 >> 0x20);
      pbVar5 = (bdId *)((long)pbVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      pmVar3 = (mapped_type *)((long)pmVar3 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

void bdNodeManager::addFindNode(bdNodeId *id, uint32_t qflags) {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::addFindNode() ";
	mDhtFns->bdPrintNodeId(std::cerr, id);
	std::cerr << std::endl;
#endif
	/* check if exists already */
	std::map<bdNodeId, bdQueryPeer>::iterator it;	
	it = mActivePeers.find(*id);
	if (it != mActivePeers.end()) {
#ifdef DEBUG_MGR
		std::cerr << "bdNodeManager::addFindNode() Found existing....";
		std::cerr << std::endl;
#endif
		return;
	}

	/* add to map */
	bdQueryPeer peer;
	peer.mId.id = (*id);
	peer.mStatus = BITDHT_QUERY_READY; //QUERYING;
	peer.mQFlags = qflags;

	peer.mDhtAddr.sin_addr.s_addr = 0;
	peer.mDhtAddr.sin_port = 0;

	peer.mCallbackTS = 0;

	mActivePeers[*id] = peer;
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::addFindNode() Added QueryPeer as READY....";
	std::cerr << std::endl;
#endif
	//addQuery(id, qflags | BITDHT_QFLAGS_DISGUISE); 
	return;
}